

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_filter_pusher.cpp
# Opt level: O2

void __thiscall duckdb::CTEFilterPusher::FindCandidates(CTEFilterPusher *this,LogicalOperator *op)

{
  pointer puVar1;
  LogicalOperatorType LVar2;
  LogicalMaterializedCTE *pLVar3;
  reference pvVar4;
  pointer pLVar5;
  LogicalCTERef *pLVar6;
  iterator iVar7;
  pointer pMVar8;
  type op_00;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  pointer this_00;
  templated_unique_single_t value;
  string key;
  unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>_>
  uStack_48;
  string local_40;
  
  LVar2 = op->type;
  if (LVar2 == LOGICAL_FILTER) {
    pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::get<true>(&op->children,0);
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(pvVar4);
    if (pLVar5->type == LOGICAL_CTE_REF) {
      pvVar4 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::get<true>(&op->children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar4);
      pLVar6 = LogicalOperator::Cast<duckdb::LogicalCTERef>(pLVar5);
      ::std::__cxx11::to_string(&local_40,pLVar6->cte_index);
      iVar7 = InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
              ::find(&this->cte_info_map,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      if (iVar7._M_current ==
          (this->cte_info_map).map.
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
          .
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        return;
      }
      pMVar8 = unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
               ::operator->(&(iVar7._M_current)->second);
      local_40._M_dataplus._M_p = (pointer)op;
      ::std::
      vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
      ::emplace_back<std::reference_wrapper<duckdb::LogicalOperator>>
                ((vector<std::reference_wrapper<duckdb::LogicalOperator>,std::allocator<std::reference_wrapper<duckdb::LogicalOperator>>>
                  *)&pMVar8->filters,(reference_wrapper<duckdb::LogicalOperator> *)&local_40);
      return;
    }
    LVar2 = op->type;
  }
  else if (LVar2 == LOGICAL_MATERIALIZED_CTE) {
    pLVar3 = LogicalOperator::Cast<duckdb::LogicalMaterializedCTE>(op);
    ::std::__cxx11::to_string(&local_40,(pLVar3->super_LogicalCTE).table_index);
    make_uniq<duckdb::CTEFilterPusher::MaterializedCTEInfo,duckdb::LogicalOperator&>
              ((duckdb *)&uStack_48,op);
    InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
    ::insert(&this->cte_info_map,&local_40,
             (unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
              *)&uStack_48);
    ::std::
    unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>_>
    ::~unique_ptr(&uStack_48);
    ::std::__cxx11::string::~string((string *)&local_40);
    goto LAB_01253758;
  }
  if (LVar2 == LOGICAL_CTE_REF) {
    pLVar6 = LogicalOperator::Cast<duckdb::LogicalCTERef>(op);
    ::std::__cxx11::to_string(&local_40,pLVar6->cte_index);
    iVar7 = InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
            ::find(&this->cte_info_map,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
    if (iVar7._M_current ==
        (this->cte_info_map).map.
        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
        .
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pMVar8 = unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
             ::operator->(&(iVar7._M_current)->second);
    pMVar8->all_cte_refs_are_filtered = false;
    return;
  }
LAB_01253758:
  puVar1 = (op->children).
           super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (op->children).
                 super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_00);
    FindCandidates(this,op_00);
  }
  return;
}

Assistant:

void CTEFilterPusher::FindCandidates(LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
		// We encountered a new CTE, add it to the map
		auto key = to_string(op.Cast<LogicalMaterializedCTE>().table_index);
		auto value = make_uniq<MaterializedCTEInfo>(op);

		cte_info_map.insert(key, std::move(value));
	} else if (op.type == LogicalOperatorType::LOGICAL_FILTER &&
	           op.children[0]->type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// We encountered a filtered CTE ref, update the according CTE info
		auto &cte_ref = op.children[0]->Cast<LogicalCTERef>();
		auto it = cte_info_map.find(to_string(cte_ref.cte_index));
		if (it != cte_info_map.end()) {
			it->second->filters.push_back(op);
		}
		return;
	} else if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// We encountered a CTE ref without a filter on top, so we can't do the optimization
		auto &cte_ref = op.Cast<LogicalCTERef>();
		auto it = cte_info_map.find(to_string(cte_ref.cte_index));
		if (it != cte_info_map.end()) {
			it->second->all_cte_refs_are_filtered = false;
		}
		return;
	}
	for (auto &child : op.children) {
		FindCandidates(*child);
	}
}